

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costSecondPartialDerivativeWRTControl
          (QuadraticLikeCost *this,double time,VectorDynSize *param_2,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  bool isValid;
  ostringstream errorMsg;
  char local_201;
  double local_200;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  local_1d8 [3];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_60;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_40;
  
  local_200 = time;
  uVar4 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)partialDerivative,uVar4);
  peVar1 = (this->m_timeVaryingControlHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    iDynTree::MatrixDynSize::zero();
LAB_001970f3:
    bVar2 = true;
  }
  else {
    local_201 = '\0';
    iVar3 = (*peVar1->_vptr_TimeVaryingObject[2])(SUB84(local_200,0),peVar1,&local_201);
    if (local_201 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::operator<<((ostream *)local_1d8,"Unable to retrieve a valid control hessian at time: ");
      poVar7 = std::ostream::_M_insert<double>(local_200);
      std::operator<<(poVar7,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",
                 (char *)local_1f8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      lVar5 = iDynTree::MatrixDynSize::rows();
      lVar6 = iDynTree::MatrixDynSize::cols();
      if (lVar5 == lVar6) {
        lVar5 = iDynTree::MatrixDynSize::rows();
        lVar6 = iDynTree::VectorDynSize::size();
        if (lVar5 == lVar6) {
          toEigen(&local_1f8,(MatrixDynSize *)CONCAT44(extraout_var,iVar3));
          toEigen(&local_40,(MatrixDynSize *)CONCAT44(extraout_var,iVar3));
          local_1d8[0].m_lhs.m_rows.m_value =
               local_40.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
          local_1d8[0].m_lhs.m_cols.m_value =
               local_40.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_1d8[0].m_lhs.m_functor.m_other = 0.5;
          local_1d8[0].m_rhs.m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_1f8.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_1d8[0].m_rhs.m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_1f8.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_1d8[0].m_rhs.m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value =
               local_1f8.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
          local_1d8[0].m_rhs.m_rhs.m_matrix.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_40.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_1d8[0].m_rhs.m_rhs.m_matrix.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_40.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_1d8[0].m_rhs.m_rhs.m_matrix.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value =
               local_40.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
          toEigen(&local_60,partialDerivative);
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>const>const>>
                    (&local_60,local_1d8);
          goto LAB_001970f3;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::operator<<((ostream *)local_1d8,"The hessian at time: ");
        poVar7 = std::ostream::_M_insert<double>(local_200);
        std::operator<<(poVar7," does not match the control dimension.");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",
                   (char *)local_1f8.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::operator<<((ostream *)local_1d8,"The control hessian at time: ");
        poVar7 = std::ostream::_M_insert<double>(local_200);
        std::operator<<(poVar7," is not squared.");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",
                   (char *)local_1f8.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
    }
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QuadraticLikeCost::costSecondPartialDerivativeWRTControl(double time,
                                                                  const iDynTree::VectorDynSize& /*state*/,
                                                                  const iDynTree::VectorDynSize& control,
                                                                  iDynTree::MatrixDynSize& partialDerivative)
        {
            partialDerivative.resize(control.size(), control.size());

            if (m_timeVaryingControlHessian) {

                bool isValid = false;
                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                toEigen(partialDerivative) = 0.5 * (toEigen(hessian) + toEigen(hessian).transpose());
            } else {
                partialDerivative.zero();
            }
            return true;
        }